

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeDestroy(sqlite3_vtab *pVtab)

{
  char *pcVar1;
  long in_RDI;
  char *zCreate;
  int rc;
  Rtree *pRtree;
  sqlite3_callback in_stack_00000028;
  char *in_stack_00000030;
  sqlite3 *in_stack_00000038;
  int local_14;
  
  pcVar1 = sqlite3_mprintf("DROP TABLE \'%q\'.\'%q_node\';DROP TABLE \'%q\'.\'%q_rowid\';DROP TABLE \'%q\'.\'%q_parent\';"
                           ,*(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x38),
                           *(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x38),
                           *(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x38));
  if (pcVar1 == (char *)0x0) {
    local_14 = 7;
  }
  else {
    local_14 = sqlite3_exec(in_stack_00000038,in_stack_00000030,in_stack_00000028,pVtab,
                            (char **)pRtree);
    sqlite3_free((void *)0x1d23de);
  }
  if (local_14 == 0) {
    rtreeRelease((Rtree *)0x1d23ef);
  }
  return local_14;
}

Assistant:

static int rtreeDestroy(sqlite3_vtab *pVtab){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc;
  char *zCreate = sqlite3_mprintf(
    "DROP TABLE '%q'.'%q_node';"
    "DROP TABLE '%q'.'%q_rowid';"
    "DROP TABLE '%q'.'%q_parent';",
    pRtree->zDb, pRtree->zName, 
    pRtree->zDb, pRtree->zName,
    pRtree->zDb, pRtree->zName
  );
  if( !zCreate ){
    rc = SQLITE_NOMEM;
  }else{
    rc = sqlite3_exec(pRtree->db, zCreate, 0, 0, 0);
    sqlite3_free(zCreate);
  }
  if( rc==SQLITE_OK ){
    rtreeRelease(pRtree);
  }

  return rc;
}